

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JSONValue.cpp
# Opt level: O3

JSONValue * JSONValue::Parse(wchar_t **data)

{
  wchar_t *pwVar1;
  wchar_t wVar2;
  JSONValue *this;
  bool bVar3;
  int iVar4;
  wchar_t wVar5;
  JSONValue *pJVar6;
  long lVar7;
  JSONValue *pJVar8;
  iterator iVar9;
  mapped_type *ppJVar10;
  undefined8 uVar11;
  _Self __tmp;
  undefined1 auVar12 [8];
  wchar_t *pwVar13;
  _Self __tmp_1;
  double dVar14;
  ulong extraout_XMM0_Qb;
  double dVar15;
  wstring str;
  wstring name;
  undefined1 local_98 [8];
  undefined8 uStack_90;
  anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
  local_88;
  _Rb_tree_node_base *local_78;
  size_t local_70;
  wstring *local_68;
  ulong uStack_60;
  wstring local_50;
  
  pwVar13 = *data;
  if (*pwVar13 == L'\"') {
    uStack_90 = (JSONValue **)0x0;
    local_88._M_allocated_capacity = local_88._M_allocated_capacity & 0xffffffff00000000;
    *data = pwVar13 + 1;
    local_98 = (undefined1  [8])&local_88;
    bVar3 = JSON::ExtractString(data,(wstring *)local_98);
    if (bVar3) {
      pJVar6 = (JSONValue *)operator_new(0x10);
      JSONValue(pJVar6,(wstring *)local_98);
    }
    else {
      pJVar6 = (JSONValue *)0x0;
    }
    if (local_98 == (undefined1  [8])&local_88) {
      return pJVar6;
    }
    goto LAB_00171189;
  }
  lVar7 = 0;
  do {
    if (lVar7 == 4) {
      iVar4 = wcsncasecmp(pwVar13,L"true",4);
      if (iVar4 == 0) goto LAB_001711bf;
      pwVar13 = *data;
      break;
    }
    pwVar1 = pwVar13 + lVar7;
    lVar7 = lVar7 + 1;
  } while (*pwVar1 != L'\0');
  lVar7 = 0;
  do {
    if (lVar7 == 5) {
      iVar4 = wcsncasecmp(pwVar13,L"false",5);
      if (iVar4 == 0) {
LAB_001711bf:
        iVar4 = wcsncasecmp(*data,L"true",4);
        *data = (wchar_t *)((long)*data + (ulong)((iVar4 == 0 ^ 5) << 2));
        pJVar6 = (JSONValue *)operator_new(0x10);
        pJVar6->type = JSONType_Bool;
        (pJVar6->field_1).bool_value = iVar4 == 0;
        return pJVar6;
      }
      pwVar13 = *data;
      break;
    }
    pwVar1 = pwVar13 + lVar7;
    lVar7 = lVar7 + 1;
  } while (*pwVar1 != L'\0');
  lVar7 = 0;
  do {
    if (lVar7 == 4) {
      iVar4 = wcsncasecmp(pwVar13,L"null",4);
      pwVar13 = *data;
      if (iVar4 == 0) {
        *data = pwVar13 + 4;
        pJVar6 = (JSONValue *)operator_new(0x10);
        pJVar6->type = JSONType_Null;
        return pJVar6;
      }
      break;
    }
    pwVar1 = pwVar13 + lVar7;
    lVar7 = lVar7 + 1;
  } while (*pwVar1 != L'\0');
  wVar2 = *pwVar13;
  pJVar6 = (JSONValue *)(ulong)(uint)wVar2;
  if (wVar2 == L'-') {
    *data = pwVar13 + 1;
    pwVar1 = pwVar13 + 1;
    pwVar13 = pwVar13 + 1;
    wVar5 = *pwVar1;
LAB_00171247:
    if (wVar5 == L'0') {
      pwVar13 = pwVar13 + 1;
      *data = pwVar13;
      local_68 = (wstring *)0x0;
      uStack_60 = 0;
    }
    else {
      if (8 < (uint)(wVar5 + L'\xffffffcf')) {
        return (JSONValue *)0x0;
      }
      local_68 = (wstring *)JSON::ParseInt(data);
      pwVar13 = *data;
      uStack_60 = extraout_XMM0_Qb;
    }
    wVar5 = *pwVar13;
    if (wVar5 == L'.') {
      *data = pwVar13 + 1;
      if (9 < (uint)(pwVar13[1] + L'\xffffffd0')) {
        return (JSONValue *)0x0;
      }
      dVar14 = JSON::ParseDecimal(data);
      local_68 = (wstring *)((double)local_68 + dVar14);
      pwVar13 = *data;
      wVar5 = *pwVar13;
    }
    if ((wVar5 | 0x20U) == 0x65) {
      *data = pwVar13 + 1;
      wVar5 = pwVar13[1];
      if ((wVar5 == L'-') || (wVar5 == L'+')) {
        bVar3 = wVar5 == L'-';
        *data = pwVar13 + 2;
        wVar5 = pwVar13[2];
      }
      else {
        bVar3 = false;
      }
      if (9 < (uint)(wVar5 + L'\xffffffd0')) {
        return (JSONValue *)0x0;
      }
      dVar14 = JSON::ParseInt(data);
      dVar15 = 0.0;
      if (0.0 < dVar14) {
        do {
          if (bVar3) {
            local_68 = (wstring *)((double)local_68 / 10.0);
          }
          else {
            local_68 = (wstring *)((double)local_68 * 10.0);
          }
          dVar15 = dVar15 + 1.0;
        } while (dVar15 < dVar14);
      }
    }
    if (wVar2 == L'-') {
      local_68 = (wstring *)((ulong)local_68 ^ 0x8000000000000000);
      uStack_60 = uStack_60 ^ 0x8000000000000000;
    }
    pJVar6 = (JSONValue *)operator_new(0x10);
    pJVar6->type = JSONType_Number;
    (pJVar6->field_1).string_value = local_68;
    return pJVar6;
  }
  wVar5 = wVar2;
  if ((uint)(wVar2 + L'\xffffffd0') < 10) goto LAB_00171247;
  if (wVar2 != L'[') {
    if (wVar2 != L'{') {
      return (JSONValue *)0x0;
    }
    uStack_90 = (JSONValue **)((ulong)uStack_90._4_4_ << 0x20);
    local_88._M_allocated_capacity = 0;
    local_70 = 0;
    *data = pwVar13 + 1;
    local_88._8_8_ = (_Rb_tree_node_base *)&uStack_90;
    local_78 = (_Rb_tree_node_base *)&uStack_90;
    do {
      if (**data == L'\0') {
        if ((_Rb_tree_node_base *)local_88._8_8_ == (_Rb_tree_node_base *)&uStack_90) {
LAB_0017185b:
          pJVar6 = (JSONValue *)0x0;
        }
        else {
          pJVar6 = (JSONValue *)0x0;
          uVar11 = local_88._8_8_;
          do {
            pJVar8 = *(JSONValue **)(uVar11 + 0x40);
            if (pJVar8 != (JSONValue *)0x0) {
              ~JSONValue(pJVar8);
            }
            operator_delete(pJVar8);
            uVar11 = std::_Rb_tree_increment((_Rb_tree_node_base *)uVar11);
          } while ((_Rb_tree_node_base *)uVar11 != (_Rb_tree_node_base *)&uStack_90);
        }
        break;
      }
      bVar3 = JSON::SkipWhitespace(data);
      if (!bVar3) {
        if ((_Rb_tree_node_base *)local_88._8_8_ != (_Rb_tree_node_base *)&uStack_90) {
          pJVar6 = (JSONValue *)0x0;
          uVar11 = local_88._8_8_;
          do {
            pJVar8 = *(JSONValue **)(uVar11 + 0x40);
            if (pJVar8 != (JSONValue *)0x0) {
              ~JSONValue(pJVar8);
            }
            operator_delete(pJVar8);
            uVar11 = std::_Rb_tree_increment((_Rb_tree_node_base *)uVar11);
          } while ((_Rb_tree_node_base *)uVar11 != (_Rb_tree_node_base *)&uStack_90);
          break;
        }
        goto LAB_0017185b;
      }
      pwVar13 = *data;
      if ((local_70 == 0) && (*pwVar13 == L'}')) {
        *data = pwVar13 + 1;
        pJVar6 = (JSONValue *)operator_new(0x10);
        JSONValue(pJVar6,(JSONObject *)local_98);
        break;
      }
      local_50._M_string_length = 0;
      local_50.field_2._M_local_buf[0] = L'\0';
      *data = pwVar13 + 1;
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      bVar3 = JSON::ExtractString(data,&local_50);
      uVar11 = local_88._8_8_;
      if (bVar3) {
        bVar3 = JSON::SkipWhitespace(data);
        uVar11 = local_88._8_8_;
        if (!bVar3) {
          for (; (_Rb_tree_node_base *)uVar11 != (_Rb_tree_node_base *)&uStack_90;
              uVar11 = std::_Rb_tree_increment((_Rb_tree_node_base *)uVar11)) {
            pJVar6 = *(JSONValue **)(uVar11 + 0x40);
            if (pJVar6 != (JSONValue *)0x0) {
              ~JSONValue(pJVar6);
            }
            operator_delete(pJVar6);
          }
          goto LAB_00171545;
        }
        pwVar13 = *data;
        *data = pwVar13 + 1;
        if (*pwVar13 != L':') {
          for (; (_Rb_tree_node_base *)uVar11 != (_Rb_tree_node_base *)&uStack_90;
              uVar11 = std::_Rb_tree_increment((_Rb_tree_node_base *)uVar11)) {
            pJVar6 = *(JSONValue **)(uVar11 + 0x40);
            if (pJVar6 != (JSONValue *)0x0) {
              ~JSONValue(pJVar6);
            }
            operator_delete(pJVar6);
          }
          goto LAB_00171545;
        }
        bVar3 = JSON::SkipWhitespace(data);
        uVar11 = local_88._8_8_;
        if (!bVar3) {
          for (; (_Rb_tree_node_base *)uVar11 != (_Rb_tree_node_base *)&uStack_90;
              uVar11 = std::_Rb_tree_increment((_Rb_tree_node_base *)uVar11)) {
            pJVar6 = *(JSONValue **)(uVar11 + 0x40);
            if (pJVar6 != (JSONValue *)0x0) {
              ~JSONValue(pJVar6);
            }
            operator_delete(pJVar6);
          }
          goto LAB_00171545;
        }
        pJVar8 = Parse(data);
        if (pJVar8 == (JSONValue *)0x0) {
          uVar11 = local_88._8_8_;
          if ((_Rb_tree_node_base *)local_88._8_8_ == (_Rb_tree_node_base *)&uStack_90)
          goto LAB_00171545;
          do {
            pJVar6 = *(JSONValue **)(uVar11 + 0x40);
            if (pJVar6 != (JSONValue *)0x0) {
              ~JSONValue(pJVar6);
            }
            operator_delete(pJVar6);
            uVar11 = std::_Rb_tree_increment((_Rb_tree_node_base *)uVar11);
            bVar3 = false;
            pJVar6 = (JSONValue *)0x0;
          } while ((_Rb_tree_node_base *)uVar11 != (_Rb_tree_node_base *)&uStack_90);
        }
        else {
          iVar9 = std::
                  _Rb_tree<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_JSONValue_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_JSONValue_*>_>,_std::less<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_JSONValue_*>_>_>
                  ::find((_Rb_tree<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_JSONValue_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_JSONValue_*>_>,_std::less<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_JSONValue_*>_>_>
                          *)local_98,&local_50);
          if (iVar9._M_node != (_Rb_tree_node_base *)&uStack_90) {
            ppJVar10 = std::
                       map<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_JSONValue_*,_std::less<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_JSONValue_*>_>_>
                       ::operator[]((map<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_JSONValue_*,_std::less<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_JSONValue_*>_>_>
                                     *)local_98,&local_50);
            this = *ppJVar10;
            if (this != (JSONValue *)0x0) {
              ~JSONValue(this);
            }
            operator_delete(this);
          }
          ppJVar10 = std::
                     map<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_JSONValue_*,_std::less<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_JSONValue_*>_>_>
                     ::operator[]((map<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_JSONValue_*,_std::less<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_JSONValue_*>_>_>
                                   *)local_98,&local_50);
          *ppJVar10 = pJVar8;
          bVar3 = JSON::SkipWhitespace(data);
          if (bVar3) {
            pwVar13 = *data;
            if (*pwVar13 == L',') {
              *data = pwVar13 + 1;
              bVar3 = true;
            }
            else if (*pwVar13 == L'}') {
              *data = pwVar13 + 1;
              pJVar6 = (JSONValue *)operator_new(0x10);
              JSONValue(pJVar6,(JSONObject *)local_98);
              bVar3 = false;
            }
            else {
              uVar11 = local_88._8_8_;
              if ((_Rb_tree_node_base *)local_88._8_8_ == (_Rb_tree_node_base *)&uStack_90)
              goto LAB_00171545;
              do {
                pJVar6 = *(JSONValue **)(uVar11 + 0x40);
                if (pJVar6 != (JSONValue *)0x0) {
                  ~JSONValue(pJVar6);
                }
                operator_delete(pJVar6);
                uVar11 = std::_Rb_tree_increment((_Rb_tree_node_base *)uVar11);
                bVar3 = false;
                pJVar6 = (JSONValue *)0x0;
              } while ((_Rb_tree_node_base *)uVar11 != (_Rb_tree_node_base *)&uStack_90);
            }
          }
          else {
            uVar11 = local_88._8_8_;
            if ((_Rb_tree_node_base *)local_88._8_8_ == (_Rb_tree_node_base *)&uStack_90)
            goto LAB_00171545;
            do {
              pJVar6 = *(JSONValue **)(uVar11 + 0x40);
              if (pJVar6 != (JSONValue *)0x0) {
                ~JSONValue(pJVar6);
              }
              operator_delete(pJVar6);
              uVar11 = std::_Rb_tree_increment((_Rb_tree_node_base *)uVar11);
              bVar3 = false;
              pJVar6 = (JSONValue *)0x0;
            } while ((_Rb_tree_node_base *)uVar11 != (_Rb_tree_node_base *)&uStack_90);
          }
        }
      }
      else {
        for (; (_Rb_tree_node_base *)uVar11 != (_Rb_tree_node_base *)&uStack_90;
            uVar11 = std::_Rb_tree_increment((_Rb_tree_node_base *)uVar11)) {
          pJVar6 = *(JSONValue **)(uVar11 + 0x40);
          if (pJVar6 != (JSONValue *)0x0) {
            ~JSONValue(pJVar6);
          }
          operator_delete(pJVar6);
        }
LAB_00171545:
        bVar3 = false;
        pJVar6 = (JSONValue *)0x0;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p);
      }
    } while (bVar3);
    std::
    _Rb_tree<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_JSONValue_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_JSONValue_*>_>,_std::less<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_JSONValue_*>_>_>
    ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_JSONValue_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_JSONValue_*>_>,_std::less<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_JSONValue_*>_>_>
                 *)local_98);
    return pJVar6;
  }
  local_98 = (undefined1  [8])0x0;
  uStack_90 = (JSONValue **)0x0;
  local_88._M_allocated_capacity = 0;
  *data = pwVar13 + 1;
  if (pwVar13[1] != L'\0') {
LAB_001716e3:
    bVar3 = JSON::SkipWhitespace(data);
    if (!bVar3) {
      if (local_98 != (undefined1  [8])uStack_90) {
        pJVar6 = (JSONValue *)0x0;
        auVar12 = local_98;
        do {
          pJVar8 = *(JSONValue **)auVar12;
          if (pJVar8 != (JSONValue *)0x0) {
            ~JSONValue(pJVar8);
          }
          operator_delete(pJVar8);
          auVar12 = (undefined1  [8])((long)auVar12 + 8);
        } while (auVar12 != (undefined1  [8])uStack_90);
        goto LAB_00171997;
      }
      goto LAB_001719b6;
    }
    if (((undefined1  [8])uStack_90 == local_98) && (**data == L']')) {
      *data = *data + 1;
      pJVar6 = (JSONValue *)operator_new(0x10);
      JSONValue(pJVar6,(JSONArray *)local_98);
      goto LAB_00171997;
    }
    local_50._M_dataplus._M_p = (pointer)Parse(data);
    if ((JSONValue *)local_50._M_dataplus._M_p == (JSONValue *)0x0) {
      if (local_98 != (undefined1  [8])uStack_90) {
        pJVar6 = (JSONValue *)0x0;
        auVar12 = local_98;
        do {
          pJVar8 = *(JSONValue **)auVar12;
          if (pJVar8 != (JSONValue *)0x0) {
            ~JSONValue(pJVar8);
          }
          operator_delete(pJVar8);
          auVar12 = (undefined1  [8])((long)auVar12 + 8);
        } while (auVar12 != (undefined1  [8])uStack_90);
        goto LAB_00171997;
      }
      goto LAB_00171990;
    }
    if (uStack_90 == (JSONValue **)local_88._M_allocated_capacity) {
      std::vector<JSONValue*,std::allocator<JSONValue*>>::_M_realloc_insert<JSONValue*const&>
                ((vector<JSONValue*,std::allocator<JSONValue*>> *)local_98,uStack_90,
                 (JSONValue **)&local_50);
    }
    else {
      *uStack_90 = (JSONValue *)local_50._M_dataplus._M_p;
      uStack_90 = uStack_90 + 1;
    }
    bVar3 = JSON::SkipWhitespace(data);
    if (!bVar3) {
      if (local_98 != (undefined1  [8])uStack_90) {
        pJVar6 = (JSONValue *)0x0;
        auVar12 = local_98;
        do {
          pJVar8 = *(JSONValue **)auVar12;
          if (pJVar8 != (JSONValue *)0x0) {
            ~JSONValue(pJVar8);
          }
          operator_delete(pJVar8);
          auVar12 = (undefined1  [8])((long)auVar12 + 8);
        } while (auVar12 != (undefined1  [8])uStack_90);
        goto LAB_00171997;
      }
      goto LAB_00171990;
    }
    pwVar13 = *data;
    if (*pwVar13 == L',') goto code_r0x00171760;
    if (*pwVar13 == L']') {
      *data = pwVar13 + 1;
      pJVar6 = (JSONValue *)operator_new(0x10);
      JSONValue(pJVar6,(JSONArray *)local_98);
      goto LAB_00171997;
    }
    if (local_98 != (undefined1  [8])uStack_90) {
      pJVar6 = (JSONValue *)0x0;
      auVar12 = local_98;
      do {
        pJVar8 = *(JSONValue **)auVar12;
        if (pJVar8 != (JSONValue *)0x0) {
          ~JSONValue(pJVar8);
        }
        operator_delete(pJVar8);
        auVar12 = (undefined1  [8])((long)auVar12 + 8);
      } while (auVar12 != (undefined1  [8])uStack_90);
      goto LAB_00171997;
    }
  }
LAB_00171990:
  pJVar6 = (JSONValue *)0x0;
  goto LAB_00171997;
code_r0x00171760:
  *data = pwVar13 + 1;
  if (pwVar13[1] == L'\0') goto code_r0x00171771;
  goto LAB_001716e3;
code_r0x00171771:
  if (local_98 == (undefined1  [8])uStack_90) {
LAB_001719b6:
    pJVar6 = (JSONValue *)0x0;
  }
  else {
    pJVar6 = (JSONValue *)0x0;
    auVar12 = local_98;
    do {
      pJVar8 = *(JSONValue **)auVar12;
      if (pJVar8 != (JSONValue *)0x0) {
        ~JSONValue(pJVar8);
      }
      operator_delete(pJVar8);
      auVar12 = (undefined1  [8])((long)auVar12 + 8);
    } while (auVar12 != (undefined1  [8])uStack_90);
  }
LAB_00171997:
  if (local_98 == (undefined1  [8])0x0) {
    return pJVar6;
  }
LAB_00171189:
  operator_delete((void *)local_98);
  return pJVar6;
}

Assistant:

JSONValue *JSONValue::Parse(const wchar_t **data)
{
	// Is it a string?
	if (**data == '"')
	{
		std::wstring str;
		if (!JSON::ExtractString(&(++(*data)), str))
			return NULL;
		else
			return new JSONValue(str);
	}

	// Is it a boolean?
	else if ((simplejson_wcsnlen(*data, 4) && wcsncasecmp(*data, L"true", 4) == 0) || (simplejson_wcsnlen(*data, 5) && wcsncasecmp(*data, L"false", 5) == 0))
	{
		bool value = wcsncasecmp(*data, L"true", 4) == 0;
		(*data) += value ? 4 : 5;
		return new JSONValue(value);
	}

	// Is it a null?
	else if (simplejson_wcsnlen(*data, 4) && wcsncasecmp(*data, L"null", 4) == 0)
	{
		(*data) += 4;
		return new JSONValue();
	}

	// Is it a number?
	else if (**data == L'-' || (**data >= L'0' && **data <= L'9'))
	{
		// Negative?
		bool neg = **data == L'-';
		if (neg) (*data)++;

		double number = 0.0;

		// Parse the whole part of the number - only if it wasn't 0
		if (**data == L'0')
			(*data)++;
		else if (**data >= L'1' && **data <= L'9')
			number = JSON::ParseInt(data);
		else
			return NULL;

		// Could be a decimal now...
		if (**data == '.')
		{
			(*data)++;

			// Not get any digits?
			if (!(**data >= L'0' && **data <= L'9'))
				return NULL;

			// Find the decimal and sort the decimal place out
			// Use ParseDecimal as ParseInt won't work with decimals less than 0.1
			// thanks to Javier Abadia for the report & fix
			double decimal = JSON::ParseDecimal(data);

			// Save the number
			number += decimal;
		}

		// Could be an exponent now...
		if (**data == L'E' || **data == L'e')
		{
			(*data)++;

			// Check signage of expo
			bool neg_expo = false;
			if (**data == L'-' || **data == L'+')
			{
				neg_expo = **data == L'-';
				(*data)++;
			}

			// Not get any digits?
			if (!(**data >= L'0' && **data <= L'9'))
				return NULL;

			// Sort the expo out
			double expo = JSON::ParseInt(data);
			for (double i = 0.0; i < expo; i++)
				number = neg_expo ? (number / 10.0) : (number * 10.0);
		}

		// Was it neg?
		if (neg) number *= -1;

		return new JSONValue(number);
	}

	// An object?
	else if (**data == L'{')
	{
		JSONObject object;

		(*data)++;

		while (**data != 0)
		{
			// Whitespace at the start?
			if (!JSON::SkipWhitespace(data))
			{
				FREE_OBJECT(object);
				return NULL;
			}

			// Special case - empty object
			if (object.size() == 0 && **data == L'}')
			{
				(*data)++;
				return new JSONValue(object);
			}

			// We want a string now...
			std::wstring name;
			if (!JSON::ExtractString(&(++(*data)), name))
			{
				FREE_OBJECT(object);
				return NULL;
			}

			// More whitespace?
			if (!JSON::SkipWhitespace(data))
			{
				FREE_OBJECT(object);
				return NULL;
			}

			// Need a : now
			if (*((*data)++) != L':')
			{
				FREE_OBJECT(object);
				return NULL;
			}

			// More whitespace?
			if (!JSON::SkipWhitespace(data))
			{
				FREE_OBJECT(object);
				return NULL;
			}

			// The value is here
			JSONValue *value = Parse(data);
			if (value == NULL)
			{
				FREE_OBJECT(object);
				return NULL;
			}

			// Add the name:value
			if (object.find(name) != object.end())
				delete object[name];
			object[name] = value;

			// More whitespace?
			if (!JSON::SkipWhitespace(data))
			{
				FREE_OBJECT(object);
				return NULL;
			}

			// End of object?
			if (**data == L'}')
			{
				(*data)++;
				return new JSONValue(object);
			}

			// Want a , now
			if (**data != L',')
			{
				FREE_OBJECT(object);
				return NULL;
			}

			(*data)++;
		}

		// Only here if we ran out of data
		FREE_OBJECT(object);
		return NULL;
	}

	// An array?
	else if (**data == L'[')
	{
		JSONArray array;

		(*data)++;

		while (**data != 0)
		{
			// Whitespace at the start?
			if (!JSON::SkipWhitespace(data))
			{
				FREE_ARRAY(array);
				return NULL;
			}

			// Special case - empty array
			if (array.size() == 0 && **data == L']')
			{
				(*data)++;
				return new JSONValue(array);
			}

			// Get the value
			JSONValue *value = Parse(data);
			if (value == NULL)
			{
				FREE_ARRAY(array);
				return NULL;
			}

			// Add the value
			array.push_back(value);

			// More whitespace?
			if (!JSON::SkipWhitespace(data))
			{
				FREE_ARRAY(array);
				return NULL;
			}

			// End of array?
			if (**data == L']')
			{
				(*data)++;
				return new JSONValue(array);
			}

			// Want a , now
			if (**data != L',')
			{
				FREE_ARRAY(array);
				return NULL;
			}

			(*data)++;
		}

		// Only here if we ran out of data
		FREE_ARRAY(array);
		return NULL;
	}

	// Ran out of possibilites, it's bad!
	else
	{
		return NULL;
	}
}